

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_spec.cpp
# Opt level: O3

void P_PlayerOnSpecialFlat(player_t *player,int floorType)

{
  AInventory *pAVar1;
  int iVar2;
  undefined4 extraout_var;
  FTerrainDef *pFVar4;
  PClass *pPVar5;
  PClass *pPVar6;
  AInventory *pAVar7;
  bool bVar8;
  FSoundID local_40;
  FName local_3c;
  DAngle local_38;
  PClass *pPVar3;
  
  pFVar4 = Terrains.Array;
  iVar2 = Terrains.Array[floorType].DamageAmount;
  if ((iVar2 != 0) && ((level.time & Terrains.Array[floorType].DamageTimeMask) == 0)) {
    if (Terrains.Array[floorType].AllowProtection == true) {
      pAVar1 = (player->mo->super_AActor).Inventory.field_0.p;
      if (pAVar1 != (AInventory *)0x0) {
        pPVar5 = APowerIronFeet::RegistrationInfo.MyClass;
        if (((pAVar1->super_AActor).super_DThinker.super_DObject.ObjectFlags & 0x20) == 0) {
          do {
            pAVar7 = pAVar1;
            pPVar3 = (pAVar7->super_AActor).super_DThinker.super_DObject.Class;
            pPVar6 = pPVar5;
            if (pPVar3 == (PClass *)0x0) {
              iVar2 = (**(pAVar7->super_AActor).super_DThinker.super_DObject._vptr_DObject)(pAVar7);
              pPVar3 = (PClass *)CONCAT44(extraout_var,iVar2);
              (pAVar7->super_AActor).super_DThinker.super_DObject.Class = pPVar3;
              pPVar6 = APowerIronFeet::RegistrationInfo.MyClass;
            }
            bVar8 = pPVar3 != (PClass *)0x0;
            if (pPVar3 != pPVar5 && bVar8) {
              do {
                pPVar3 = pPVar3->ParentClass;
                bVar8 = pPVar3 != (PClass *)0x0;
                if (pPVar3 == pPVar5) break;
              } while (pPVar3 != (PClass *)0x0);
            }
            if (bVar8) {
              return;
            }
            pAVar1 = (pAVar7->super_AActor).Inventory.field_0.p;
            if (pAVar1 == (AInventory *)0x0) goto LAB_004532de;
            pPVar5 = pPVar6;
          } while (((pAVar1->super_AActor).super_DThinker.super_DObject.ObjectFlags & 0x20) == 0);
          (pAVar7->super_AActor).Inventory.field_0.p = (AInventory *)0x0;
LAB_004532de:
          iVar2 = Terrains.Array[floorType].DamageAmount;
          pFVar4 = Terrains.Array;
        }
        else {
          (player->mo->super_AActor).Inventory.field_0.p = (AInventory *)0x0;
        }
      }
    }
    local_3c.Index = pFVar4[floorType].DamageMOD.Index;
    local_38.Degrees = 0.0;
    iVar2 = P_DamageMobj(&player->mo->super_AActor,(AActor *)0x0,(AActor *)0x0,iVar2,&local_3c,0,
                         &local_38);
    if ((0 < iVar2) && ((long)Terrains.Array[floorType].Splash != -1)) {
      local_40.ID = Splashes.Array[Terrains.Array[floorType].Splash].NormalSplashSound.ID;
      S_Sound(&player->mo->super_AActor,0,&local_40,1.0,1.001);
    }
  }
  return;
}

Assistant:

void P_PlayerOnSpecialFlat (player_t *player, int floorType)
{
	if (Terrains[floorType].DamageAmount &&
		!(level.time & Terrains[floorType].DamageTimeMask))
	{
		AInventory *ironfeet = NULL;

		if (Terrains[floorType].AllowProtection)
		{
			for (ironfeet = player->mo->Inventory; ironfeet != NULL; ironfeet = ironfeet->Inventory)
			{
				if (ironfeet->IsKindOf (RUNTIME_CLASS(APowerIronFeet)))
					break;
			}
		}

		int damage = 0;
		if (ironfeet == NULL)
		{
			damage = P_DamageMobj (player->mo, NULL, NULL, Terrains[floorType].DamageAmount,
				Terrains[floorType].DamageMOD);
		}
		if (damage > 0 && Terrains[floorType].Splash != -1)
		{
			S_Sound (player->mo, CHAN_AUTO,
				Splashes[Terrains[floorType].Splash].NormalSplashSound, 1,
				ATTN_IDLE);
		}
	}
}